

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseCrossThreadFulfillerPair<void> * __thiscall
kj::Executor::newPromiseAndCrossThreadFulfiller<void>
          (PromiseCrossThreadFulfillerPair<void> *__return_storage_ptr__,Executor *this)

{
  PromiseBase PVar1;
  OwnPromiseNode this_00;
  Own<kj::_::XThreadPafImpl<void>,_kj::_::PromiseDisposer> node;
  Own<kj::_::XThreadFulfiller<void>,_std::nullptr_t> fulfiller;
  PromiseBase local_50;
  Own<kj::_::XThreadFulfiller<void>,_std::nullptr_t> local_48;
  Own<const_kj::Executor,_std::nullptr_t> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  
  this_00.ptr = (PromiseNode *)operator_new(0x1e0);
  (**this->_vptr_Executor)(&local_30,this);
  kj::_::XThreadPafImpl<void>::XThreadPaf((XThreadPafImpl<void> *)this_00.ptr,&local_30);
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this_00.ptr;
  Own<const_kj::Executor,_std::nullptr_t>::dispose(&local_30);
  heap<kj::_::XThreadFulfiller<void>,kj::Own<kj::_::XThreadPafImpl<void>,kj::_::PromiseDisposer>&>
            ((kj *)&local_48,(Own<kj::_::XThreadPafImpl<void>,_kj::_::PromiseDisposer> *)&local_50);
  PVar1.node.ptr = local_50.node.ptr;
  local_50.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_20.ptr = (PromiseNode *)0x0;
  (__return_storage_ptr__->fulfiller).disposer = local_48.disposer;
  (__return_storage_ptr__->fulfiller).ptr = &(local_48.ptr)->super_CrossThreadPromiseFulfiller<void>
  ;
  local_48.ptr = (XThreadFulfiller<void> *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20);
  Own<kj::_::XThreadFulfiller<void>,_std::nullptr_t>::dispose(&local_48);
  Own<kj::_::XThreadPafImpl<void>,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::XThreadPafImpl<void>,_kj::_::PromiseDisposer> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

PromiseCrossThreadFulfillerPair<T> Executor::newPromiseAndCrossThreadFulfiller() const {
  kj::Own<_::XThreadPafImpl<T>, _::PromiseDisposer> node(new _::XThreadPafImpl<T>(addRef()));
  auto fulfiller = kj::heap<_::XThreadFulfiller<T>>(node);
  return { _::PromiseNode::to<_::ReducePromises<T>>(kj::mv(node)), kj::mv(fulfiller) };
}